

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QRegion __thiscall
QColumnView::visualRegionForSelection(QColumnView *this,QItemSelection *selection)

{
  int iVar1;
  bool bVar2;
  qsizetype qVar3;
  int *piVar4;
  QModelIndex *lhs;
  QAbstractItemModel *pQVar5;
  QList<QItemSelectionRange> *in_RDX;
  long *in_RSI;
  QRegionData *in_RDI;
  long in_FS_OFFSET;
  int i;
  int ranges;
  QRegion lastRegion;
  QRegion firstRegion;
  QModelIndex lastIdx;
  QModelIndex firstIdx;
  int lastRow;
  int firstRow;
  QModelIndex *in_stack_fffffffffffffed8;
  QRect *in_stack_fffffffffffffee0;
  QAbstractItemView *in_stack_fffffffffffffef0;
  int local_e8;
  undefined1 local_c8 [16];
  QRegion local_b8;
  undefined1 local_b0 [16];
  QRegion local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QList<QItemSelectionRange>::size(in_RDX);
  if ((int)qVar3 == 0) {
    QRect::QRect(in_stack_fffffffffffffee0);
    QRegion::QRegion((QRegion *)in_RDI,(QRect *)local_18,Rectangle);
  }
  else {
    QList<QItemSelectionRange>::at
              ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0,
               (qsizetype)in_stack_fffffffffffffed8);
    local_1c = QItemSelectionRange::top((QItemSelectionRange *)0x8644e3);
    QList<QItemSelectionRange>::at
              ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0,
               (qsizetype)in_stack_fffffffffffffed8);
    local_20 = QItemSelectionRange::top((QItemSelectionRange *)0x864500);
    for (local_e8 = 0; local_e8 < (int)qVar3; local_e8 = local_e8 + 1) {
      QList<QItemSelectionRange>::at
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0,
                 (qsizetype)in_stack_fffffffffffffed8);
      local_24 = QItemSelectionRange::top((QItemSelectionRange *)0x864534);
      piVar4 = qMin<int>(&local_1c,&local_24);
      local_1c = *piVar4;
      QList<QItemSelectionRange>::at
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0,
                 (qsizetype)in_stack_fffffffffffffed8);
      local_28 = QItemSelectionRange::bottom((QItemSelectionRange *)0x864570);
      piVar4 = qMax<int>(&local_20,&local_28);
      local_20 = *piVar4;
    }
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    lhs = (QModelIndex *)QAbstractItemView::model(in_stack_fffffffffffffef0);
    piVar4 = qMin<int>(&local_1c,&local_20);
    iVar1 = *piVar4;
    QAbstractItemView::rootIndex((QAbstractItemView *)lhs);
    (**(code **)(*(long *)lhs + 0x60))(&local_40,lhs,iVar1,0,local_58);
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QAbstractItemView::model(in_stack_fffffffffffffef0);
    piVar4 = qMax<int>(&local_1c,&local_20);
    iVar1 = *piVar4;
    QAbstractItemView::rootIndex((QAbstractItemView *)lhs);
    (**(code **)(*(long *)pQVar5 + 0x60))(&local_70,pQVar5,iVar1,0,local_88);
    bVar2 = ::operator==(lhs,in_stack_fffffffffffffed8);
    if (bVar2) {
      local_98 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_40);
      QRegion::QRegion((QRegion *)in_RDI,(QRect *)local_98,Rectangle);
    }
    else {
      local_a0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      local_b0 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_40);
      QRegion::QRegion(&local_a0,(QRect *)local_b0,Rectangle);
      local_b8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8 = (**(code **)(*in_RSI + 0x1e0))(in_RSI,&local_70);
      QRegion::QRegion(&local_b8,(QRect *)local_c8,Rectangle);
      QRegion::united((QRegion *)in_RDI);
      QRegion::~QRegion(&local_b8);
      QRegion::~QRegion(&local_a0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QColumnView::visualRegionForSelection(const QItemSelection &selection) const
{
    int ranges = selection.size();

    if (ranges == 0)
        return QRect();

    // Note that we use the top and bottom functions of the selection range
    // since the data is stored in rows.
    int firstRow = selection.at(0).top();
    int lastRow = selection.at(0).top();
    for (int i = 0; i < ranges; ++i) {
        firstRow = qMin(firstRow, selection.at(i).top());
        lastRow = qMax(lastRow, selection.at(i).bottom());
    }

    QModelIndex firstIdx = model()->index(qMin(firstRow, lastRow), 0, rootIndex());
    QModelIndex lastIdx = model()->index(qMax(firstRow, lastRow), 0, rootIndex());

    if (firstIdx == lastIdx)
        return visualRect(firstIdx);

    QRegion firstRegion = visualRect(firstIdx);
    QRegion lastRegion = visualRect(lastIdx);
    return firstRegion.united(lastRegion);
}